

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O2

int ON_ParseLengthExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *length_value,
              ON_ParseSettings *parse_results,LengthUnitSystem *str_length_unit_system)

{
  double dVar1;
  ON_ParseSettings OVar2;
  ON_ParseSettings parse_settings_00;
  ON__UINT32 aOVar3 [2];
  ON__UINT32 aOVar4 [2];
  undefined8 uVar5;
  ON__UINT16 OVar6;
  ON__UINT8 OVar7;
  ON__UINT8 OVar8;
  ON__UINT64 OVar9;
  undefined8 uVar10;
  bool bVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  undefined7 extraout_var;
  long lVar15;
  undefined8 extraout_RDX;
  int iVar16;
  int iVar17;
  wchar_t *pwVar18;
  ON_ParseSettings *pOVar19;
  double *pdVar20;
  uint uVar21;
  LengthUnitSystem length_us;
  LengthUnitSystem inches_us;
  double *local_128;
  undefined8 local_120;
  undefined4 local_114;
  ON_ParseSettings *local_110;
  wchar_t *local_108;
  double x;
  ON_ParseSettings pr;
  ON_ParseSettings input_parse_settings;
  double inches_value;
  ON_ParseSettings inches_pr;
  ON_ParseSettings parse_inches;
  ON_ParseSettings parse_unit_name_settings;
  
  OVar2 = parse_settings;
  OVar9 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar5 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar4 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar3 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  x = -1.23432101234321e+308;
  length_us = None;
  input_parse_settings.m_reserved_bits = parse_settings.m_reserved_bits;
  input_parse_settings.m_context_locale_id = parse_settings.m_context_locale_id;
  input_parse_settings.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
  input_parse_settings.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
  input_parse_settings.m_reserved = parse_settings.m_reserved;
  input_parse_settings.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
  input_parse_settings.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
  input_parse_settings.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
  input_parse_settings.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
  pr._16_8_ = ON_ParseSettings::FalseSettings._16_8_;
  pr.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  pr.m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
  pr.m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  if (length_value != (double *)0x0) {
    *length_value = -1.23432101234321e+308;
  }
  if (str_length_unit_system != (LengthUnitSystem *)0x0) {
    *str_length_unit_system = None;
  }
  uVar10 = ON_ParseSettings::FalseSettings._16_8_;
  if (parse_results != (ON_ParseSettings *)0x0) {
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar5;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar5,4);
    OVar6 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar5,6);
    OVar7 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar5,7);
    OVar8 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar10;
    parse_results->m_context_locale_id = OVar6;
    parse_results->m_context_angle_unit_system = OVar7;
    parse_results->m_context_length_unit_system = OVar8;
    parse_results->m_reserved = OVar9;
    *&parse_results->m_true_default_bits = aOVar3;
    *&parse_results->m_false_default_bits = aOVar4;
  }
  uVar13 = ON_ParseNumberExpression(str,str_count,OVar2,&pr,&x);
  if ((int)uVar13 < 1) {
    return 0;
  }
  local_128 = length_value;
  local_110 = parse_results;
  local_108 = str;
  if (str_count == -1) {
    iVar16 = -1;
    local_120._0_4_ = 1;
LAB_00572a6e:
    bVar11 = ON_ParseSettings::ParseWhiteSpaceBetweenValueAndUnitSystem(&input_parse_settings);
    pwVar18 = local_108;
    if (!bVar11) goto LAB_00572ab5;
    bVar11 = ON_ParseSettings::IsInteriorWhiteSpace(&input_parse_settings,local_108[uVar13]);
  }
  else {
    iVar16 = str_count - uVar13;
    if (str_count < (int)uVar13) {
      return 0;
    }
    if ((int)uVar13 < iVar16 || iVar16 == -1) {
      local_120._0_4_ = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),iVar16 == -1);
      goto LAB_00572a6e;
    }
    local_120 = (ulong)local_120._4_4_ << 0x20;
LAB_00572ab5:
    bVar11 = false;
    pwVar18 = local_108;
  }
  parse_unit_name_settings.m_reserved_bits = input_parse_settings.m_reserved_bits;
  parse_unit_name_settings.m_context_locale_id = input_parse_settings.m_context_locale_id;
  parse_unit_name_settings.m_context_angle_unit_system =
       input_parse_settings.m_context_angle_unit_system;
  parse_unit_name_settings.m_context_length_unit_system =
       input_parse_settings.m_context_length_unit_system;
  parse_unit_name_settings.m_reserved = input_parse_settings.m_reserved;
  parse_unit_name_settings.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
  parse_unit_name_settings.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
  parse_unit_name_settings.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
  parse_unit_name_settings.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
  ON_ParseSettings::SetParseLeadingWhiteSpace(&parse_unit_name_settings,false);
  ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem(&parse_unit_name_settings,bVar11);
  OVar2.m_false_default_bits[0] = parse_unit_name_settings.m_false_default_bits[0];
  OVar2.m_false_default_bits[1] = parse_unit_name_settings.m_false_default_bits[1];
  OVar2.m_true_default_bits[0] = parse_unit_name_settings.m_true_default_bits[0];
  OVar2.m_true_default_bits[1] = parse_unit_name_settings.m_true_default_bits[1];
  OVar2.m_reserved_bits = parse_unit_name_settings.m_reserved_bits;
  OVar2.m_context_locale_id = parse_unit_name_settings.m_context_locale_id;
  OVar2.m_context_angle_unit_system = parse_unit_name_settings.m_context_angle_unit_system;
  OVar2.m_context_length_unit_system = parse_unit_name_settings.m_context_length_unit_system;
  OVar2.m_reserved = parse_unit_name_settings.m_reserved;
  iVar14 = ON_ParseLengthUnitName(pwVar18 + uVar13,iVar16,OVar2,&length_us);
  pOVar19 = local_110;
  pdVar20 = local_128;
  if (iVar14 < 1) {
    length_us = None;
    goto LAB_00572efc;
  }
  if ((char)local_120 == '\0') {
    iVar17 = iVar16 - iVar14;
    if (iVar16 < iVar14) {
      return 0;
    }
  }
  else {
    iVar17 = -1;
  }
  uVar13 = iVar14 + uVar13;
  ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem(&pr,bVar11);
  if ((iVar17 != -1 && iVar17 < 1) || (length_us != Feet)) goto LAB_00572efc;
  local_128 = (double *)x;
  dVar1 = floor(x);
  if ((((dVar1 != (double)local_128) ||
       (((NAN(dVar1) || NAN((double)local_128) ||
         (bVar11 = ON_ParseSettings::ParseFeetInches(&input_parse_settings), !bVar11)) ||
        (bVar11 = ON_ParseSettings::ParseSignificandDecimalPoint(&pr), bVar11)))) ||
      (((bVar11 = ON_ParseSettings::ParseScientificENotation(&pr), bVar11 ||
        (bVar11 = ON_ParseSettings::ParseRationalNumber(&pr), bVar11)) ||
       (bVar11 = ON_ParseSettings::ParseMultiplication(&pr), bVar11)))) ||
     (((bVar11 = ON_ParseSettings::ParseDivision(&pr), bVar11 ||
       (bVar11 = ON_ParseSettings::ParsePi(&pr), bVar11)) ||
      (bVar11 = ON_ParseSettings::ParseIntegerDashFraction(&pr), bVar11)))) goto LAB_00572efc;
  parse_inches.m_reserved_bits = input_parse_settings.m_reserved_bits;
  parse_inches.m_context_locale_id = input_parse_settings.m_context_locale_id;
  parse_inches.m_context_angle_unit_system = input_parse_settings.m_context_angle_unit_system;
  parse_inches.m_context_length_unit_system = input_parse_settings.m_context_length_unit_system;
  parse_inches.m_reserved = input_parse_settings.m_reserved;
  parse_inches.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
  parse_inches.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
  parse_inches.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
  parse_inches.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
  local_128 = pdVar20;
  DisableStartAndExpressionParsingStuff(&parse_inches);
  ON_ParseSettings::SetParsePi(&parse_inches,false);
  ON_ParseSettings::SetParseFeetInches(&parse_inches,false);
  inches_value = -1.23432101234321e+308;
  inches_us = None;
  inches_pr.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
  inches_pr.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
  inches_pr.m_context_angle_unit_system =
       ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
  inches_pr.m_context_length_unit_system =
       ON_ParseSettings::FalseSettings.m_context_length_unit_system;
  inches_pr.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  inches_pr.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  inches_pr.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  inches_pr.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  inches_pr.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  pwVar18 = local_108 + uVar13;
  local_120 = (ulong)uVar13;
  bVar11 = ON_ParseSettings::IsNumberDash(&input_parse_settings,*pwVar18);
  iVar16 = iVar17;
  if ((bVar11) && (iVar17 == -1 || 2 < iVar17)) {
    cVar12 = ON_ParseSettings::IsDigit(&input_parse_settings,pwVar18[1]);
    iVar16 = iVar17 + -1;
    if (iVar17 == -1) {
      iVar16 = iVar17;
    }
    if (cVar12 == '\0') goto LAB_00572d30;
    lVar15 = 1;
    local_114 = 0;
LAB_00572d9b:
    uVar13 = (uint)local_120;
  }
  else {
LAB_00572d30:
    if (iVar16 == -1 || 2 < iVar16) {
      if ((((int)(uint)local_120 < iVar16) || (iVar16 == -1)) &&
         (bVar11 = ON_ParseSettings::ParseWhiteSpaceBetweenFeetAndInches(&input_parse_settings),
         bVar11)) {
        bVar11 = ON_ParseSettings::IsInteriorWhiteSpace(&input_parse_settings,*pwVar18);
        local_114 = (undefined4)CONCAT71(extraout_var,bVar11);
      }
      else {
        local_114 = 0;
      }
      ON_ParseSettings::SetParseLeadingWhiteSpace(&parse_inches,SUB41(local_114,0));
      lVar15 = 0;
      goto LAB_00572d9b;
    }
    local_114 = 0;
    lVar15 = 0;
    uVar13 = (uint)local_120;
  }
  parse_settings_00.m_false_default_bits[0] = parse_inches.m_false_default_bits[0];
  parse_settings_00.m_false_default_bits[1] = parse_inches.m_false_default_bits[1];
  parse_settings_00.m_true_default_bits[0] = parse_inches.m_true_default_bits[0];
  parse_settings_00.m_true_default_bits[1] = parse_inches.m_true_default_bits[1];
  parse_settings_00.m_reserved_bits = parse_inches.m_reserved_bits;
  parse_settings_00.m_context_locale_id = parse_inches.m_context_locale_id;
  parse_settings_00.m_context_angle_unit_system = parse_inches.m_context_angle_unit_system;
  parse_settings_00.m_context_length_unit_system = parse_inches.m_context_length_unit_system;
  parse_settings_00.m_reserved = parse_inches.m_reserved;
  iVar16 = ON_ParseLengthExpression
                     (pwVar18 + lVar15,iVar16,parse_settings_00,&inches_value,&inches_pr,&inches_us)
  ;
  uVar21 = (uint)((ulong)inches_value >> 0x20);
  pdVar20 = local_128;
  pOVar19 = local_110;
  if ((inches_us == None && iVar16 != 0) && (0.0 <= inches_value && inches_value < 12.0)) {
    if (9 < (uint)(local_108[uVar13 + (int)lVar15] + L'\xffffffd0')) goto LAB_00572efc;
    inches_us = Inches;
  }
  if ((inches_us == Inches && iVar16 != 0) && (0.0 <= inches_value && inches_value < 12.0)) {
    if (0.0 < inches_value && x < 0.0) {
      uVar21 = uVar21 ^ 0x80000000;
    }
    uVar13 = (int)lVar15 + uVar13 + iVar16;
    x = x * 12.0 + (double)CONCAT44(uVar21,SUB84(inches_value,0));
    length_us = Inches;
    ON_ParseSettings::SetParseFeetInches(&pr,true);
    ON_ParseSettings::SetParseLeadingWhiteSpace(&inches_pr,false);
    ON_ParseSettings::operator|=(&pr,&inches_pr);
    ON_ParseSettings::SetParseWhiteSpaceBetweenFeetAndInches(&pr,local_114._0_1_);
    pOVar19 = local_110;
    pdVar20 = local_128;
  }
LAB_00572efc:
  if (pdVar20 != (double *)0x0) {
    *pdVar20 = x;
  }
  if (pOVar19 != (ON_ParseSettings *)0x0) {
    pOVar19->m_reserved_bits = pr.m_reserved_bits;
    pOVar19->m_context_locale_id = pr.m_context_locale_id;
    pOVar19->m_context_angle_unit_system = pr.m_context_angle_unit_system;
    pOVar19->m_context_length_unit_system = pr.m_context_length_unit_system;
    pOVar19->m_reserved = pr.m_reserved;
    *&pOVar19->m_true_default_bits = pr.m_true_default_bits;
    *&pOVar19->m_false_default_bits = pr.m_false_default_bits;
  }
  if (str_length_unit_system != (LengthUnitSystem *)0x0) {
    *str_length_unit_system = length_us;
  }
  return uVar13;
}

Assistant:

int ON_ParseLengthExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* length_value,
  ON_ParseSettings* parse_results,
  ON::LengthUnitSystem* str_length_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::LengthUnitSystem length_us = ON::LengthUnitSystem::None;
  const ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != length_value )
    *length_value = ON_UNSET_VALUE;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  int str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
  if ( str_index <= 0 )
    return 0;

  if ( -1 != str_count )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  const bool bParseWhiteSpaceBetweenValueAndUnitSystem
    = (str_index < str_count || -1 == str_count)
    && input_parse_settings.ParseWhiteSpaceBetweenValueAndUnitSystem()
    && input_parse_settings.IsInteriorWhiteSpace(str[str_index]);
  ON_ParseSettings parse_unit_name_settings(input_parse_settings);
  parse_unit_name_settings.SetParseLeadingWhiteSpace(false);
  parse_unit_name_settings.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);
  
  const int end_of_unit_index = ON_ParseLengthUnitName(
    str+str_index,
    str_count,
    parse_unit_name_settings,
    &length_us
  );

  if ( end_of_unit_index > 0 )
  {
    if ( -1 != str_count )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    pr.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);

    if ( -1 == str_count || str_count > 0 )
    {
      if ( ON::LengthUnitSystem::Feet == length_us 
           && floor(x) == x
           && input_parse_settings.ParseFeetInches() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParseMultiplication()
           && false == pr.ParseDivision()
           && false == pr.ParsePi()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse inches part or feet and inches
        int inches_index0 = str_index;
        ON_ParseSettings parse_inches = input_parse_settings;
        DisableStartAndExpressionParsingStuff(parse_inches);
        parse_inches.SetParsePi(false);
        parse_inches.SetParseFeetInches(false);

        double inches_value = ON_UNSET_VALUE;
        ON::LengthUnitSystem inches_us = ON::LengthUnitSystem::None;
        ON_ParseSettings inches_pr = ON_ParseSettings::FalseSettings;


        // Dale Lear 9 April 2014 - fix RH-23095 
        //  Checking for a number dash is required to parse 1'-1-1/2" as 13.5 inches.
        int number_dash_count = 0;
        if ( input_parse_settings.IsNumberDash(str[inches_index0]) )
        {
          // It is intentional that the "number dash" between feet and inches
          // cannot have leading or trailing interior space.
          if (-1 == str_count || str_count >= 3)
          {
            if ( input_parse_settings.IsDigit(str[inches_index0 + 1]) )
              number_dash_count = 1;
            if (-1 != str_count)
              str_count--;
          }
        }


        // June 10, 2016 Dale Lear
        // http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
        //  Allow embedded interior white space between the feet and inches.
        //  Example <1' 3"> should parse as 15 inches.
        bool bParseWhiteSpaceBetweenFeetAndInches = false;
        if (0 == number_dash_count)
        {
          if (-1 == str_count || str_count >= 3)
          {
            bParseWhiteSpaceBetweenFeetAndInches
              = (str_index < str_count || -1 == str_count)
              && input_parse_settings.ParseWhiteSpaceBetweenFeetAndInches()
              && input_parse_settings.IsInteriorWhiteSpace(str[inches_index0]);
            parse_inches.SetParseLeadingWhiteSpace(bParseWhiteSpaceBetweenFeetAndInches);
          }
        }

        int end_of_inches_index = ON_ParseLengthExpression(
          str + inches_index0 + number_dash_count,
          str_count,
          parse_inches,&inches_value,&inches_pr,&inches_us);

        if (
          end_of_inches_index > 0
          && ON::LengthUnitSystem::None == inches_us
          && inches_value >= 0.0
          && inches_value < 12.0
          && str[inches_index0 + number_dash_count] >= '0'
          && str[inches_index0 + number_dash_count] <= '9'
          )
        {
          // "lazy" inches format 1'6 is parsed as 1'6"
          inches_us = ON::LengthUnitSystem::Inches;
        }

        if ( end_of_inches_index > 0 
             && ON::LengthUnitSystem::Inches == inches_us
             && inches_value >= 0.0 // Dale Lear: 1'0" parses as 12 inches http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
             && inches_value < 12.0
           )
        {
          // result of correctly adjusting str_count is never used.
          //if ( -1 != str_count)
          //  str_count -= end_of_inches_index;
          str_index = inches_index0 + end_of_inches_index + number_dash_count;
          if ( x < 0.0 && inches_value > 0.0 )
            x = x*12.0 - inches_value;
          else
            x = x*12.0 + inches_value;
          length_us = ON::LengthUnitSystem::Inches;
          pr.SetParseFeetInches(true);
          inches_pr.SetParseLeadingWhiteSpace(false);
          pr |= inches_pr;
          pr.SetParseWhiteSpaceBetweenFeetAndInches(bParseWhiteSpaceBetweenFeetAndInches);
        }
      }
    }
  }
  else
  {
    length_us = ON::LengthUnitSystem::None;
  }

  if ( length_value )
    *length_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;

  return str_index;
}